

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void EMIT_OP_REG_RPTR(CodeGenGenericContext *ctx,x86Command op,x86XmmReg reg1,x86Size size,
                     x86Reg index,int multiplier,x86Reg base,uint shift)

{
  x86Instruction *pxVar1;
  x86Argument arg;
  uint uVar2;
  int iVar3;
  x86Reg xVar4;
  uint uVar5;
  long lVar6;
  int *piVar7;
  x86Reg xVar8;
  ulong uVar9;
  ulong uVar10;
  x86Command op_00;
  ulong uVar11;
  x86Argument newArg;
  int local_78;
  x86Reg local_74;
  x86Argument local_70;
  x86Argument local_50;
  
  local_78 = multiplier;
  local_74 = index;
  CodeGenGenericContext::RedirectAddressComputation(ctx,&local_74,&local_78,&base,&shift);
  xVar4 = local_74;
  iVar3 = local_78;
  uVar2 = shift;
  xVar8 = base;
  uVar11 = (ulong)local_74;
  uVar10 = (ulong)base;
  local_70.type = argPtr;
  local_70.ptrBase = base;
  local_70.ptrIndex = local_74;
  local_70.ptrMult = local_78;
  local_70.ptrNum = shift;
  local_70.field_1.ptrSize = size;
  local_50.field_1.ptrSize = size;
  switch(op) {
  case o_movss:
  case o_movsd:
    uVar5 = CodeGenGenericContext::MemFind(ctx,&local_70);
    if ((uVar5 != 0) &&
       (lVar6 = (ulong)(uVar5 - 1) * 9, ctx->memCache[uVar5 - 1].value.type == argXmmReg)) {
LAB_001d17ff:
      uVar9 = (ulong)(&ctx->memCache[0].value.field_1)[lVar6].reg;
LAB_001d1818:
      EMIT_OP_REG_REG(ctx,op,reg1,(x86XmmReg)uVar9);
      return;
    }
    piVar7 = &ctx->xmmReg[0].ptrNum;
    uVar9 = 0;
    do {
      if ((((((x86Argument *)(piVar7 + -7))->type == argPtr) &&
           (((anon_union_8_6_73be8994_for_x86Argument_2 *)(piVar7 + -5))->reg == size)) &&
          (piVar7[-3] == xVar8)) &&
         (((piVar7[-2] == xVar4 && (piVar7[-1] == iVar3)) && (*piVar7 == uVar2))))
      goto LAB_001d1818;
      uVar9 = uVar9 + 1;
      piVar7 = piVar7 + 8;
    } while (uVar9 != 0x10);
    ctx->genRegRead[uVar10] = true;
    ctx->genRegRead[uVar11] = true;
    local_50.type = argPtr;
    local_50.ptrBase = xVar8;
    local_50.ptrIndex = xVar4;
    local_50.ptrMult = iVar3;
    local_50.ptrNum = uVar2;
    CodeGenGenericContext::MemRead(ctx,&local_50);
    arg._4_4_ = local_70._4_4_;
    arg.type = local_70.type;
    arg.field_1.imm64Arg._4_4_ = local_70.field_1.imm64Arg._4_4_;
    arg.field_1.ptrSize = local_70.field_1.reg;
    arg.ptrIndex = local_70.ptrIndex;
    arg.ptrBase = local_70.ptrBase;
    arg.ptrNum = local_70.ptrNum;
    arg.ptrMult = local_70.ptrMult;
    CodeGenGenericContext::OverwriteRegisterWithValue(ctx,reg1,arg);
    goto LAB_001d1aa8;
  case o_movd:
  case o_movsxd:
  case o_cvttsd2si:
switchD_001d17d6_caseD_36:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x6b8,
                  "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86XmmReg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                 );
  case o_cvtss2sd:
  case o_cvtsd2ss:
    uVar5 = CodeGenGenericContext::MemFind(ctx,&local_70);
    if ((uVar5 != 0) &&
       (lVar6 = (ulong)(uVar5 - 1) * 9, ctx->memCache[uVar5 - 1].value.type == argXmmReg))
    goto LAB_001d17ff;
    break;
  case o_cvtsi2sd:
    uVar5 = CodeGenGenericContext::MemFind(ctx,&local_70);
    if ((uVar5 != 0) && (uVar5 = uVar5 - 1, ctx->memCache[uVar5].value.type == argReg)) {
      if (ctx->memCache[uVar5].address.field_1.reg != rECX) {
        __assert_fail("ctx.memCache[memIndex].address.ptrSize == sDWORD",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0x657,
                      "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86XmmReg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                     );
      }
      xVar8 = ctx->memCache[uVar5].value.field_1.reg;
      op_00 = o_cvtsi2sd;
LAB_001d1a49:
      EMIT_OP_REG_REG(ctx,op_00,reg1,xVar8);
      return;
    }
    break;
  case o_addsd:
  case o_subsd:
  case o_mulsd:
  case o_divsd:
  case o_sqrtsd:
  case o_cmpeqsd:
  case o_cmpltsd:
  case o_cmplesd:
  case o_cmpneqsd:
    uVar5 = CodeGenGenericContext::MemFind(ctx,&local_70);
    if ((uVar5 != 0) &&
       (lVar6 = (ulong)(uVar5 - 1) * 9, ctx->memCache[uVar5 - 1].value.type == argXmmReg))
    goto LAB_001d17ff;
    ctx->genRegRead[uVar10] = true;
    ctx->genRegRead[uVar11] = true;
    local_50.type = argPtr;
    local_50.ptrBase = xVar8;
    local_50.ptrIndex = xVar4;
    local_50.ptrMult = iVar3;
    local_50.ptrNum = uVar2;
    CodeGenGenericContext::MemRead(ctx,&local_50);
    CodeGenGenericContext::InvalidateDependand(ctx,reg1);
    ctx->xmmReg[reg1].type = argNone;
    ctx->xmmRegUpdate[reg1] =
         (int)((ulong)((long)ctx->x86Op - (long)ctx->x86Base) >> 4) * -0x33333333;
    ctx->xmmRegRead[reg1] = false;
    goto LAB_001d1aa8;
  default:
    if (op != o_cvtsi2sd64) goto switchD_001d17d6_caseD_36;
    uVar5 = CodeGenGenericContext::MemFind(ctx,&local_70);
    if ((uVar5 != 0) && (uVar5 = uVar5 - 1, ctx->memCache[uVar5].value.type == argReg)) {
      if (ctx->memCache[uVar5].address.field_1.reg != rEDX) {
        __assert_fail("ctx.memCache[memIndex].address.ptrSize == sQWORD",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0x66d,
                      "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86XmmReg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                     );
      }
      xVar8 = ctx->memCache[uVar5].value.field_1.reg;
      op_00 = o_cvtsi2sd64;
      goto LAB_001d1a49;
    }
  }
  ctx->genRegRead[uVar10] = true;
  ctx->genRegRead[uVar11] = true;
  local_50.type = argPtr;
  local_50.ptrBase = xVar8;
  local_50.ptrIndex = xVar4;
  local_50.ptrMult = iVar3;
  local_50.ptrNum = uVar2;
  CodeGenGenericContext::MemRead(ctx,&local_50);
  CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
LAB_001d1aa8:
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argXmmReg;
  (pxVar1->argA).field_1.xmmArg = reg1;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).type = argPtr;
  (pxVar1->argB).field_1.ptrSize = size;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).ptrIndex = local_74;
  (pxVar1->argB).ptrMult = local_78;
  (pxVar1->argB).ptrBase = base;
  (pxVar1->argB).ptrNum = shift;
  ctx->x86Op = pxVar1 + 1;
  return;
}

Assistant:

void EMIT_OP_REG_RPTR(CodeGenGenericContext &ctx, x86Command op, x86XmmReg reg1, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift)
{
#ifdef NULLC_OPTIMIZE_X86
	ctx.RedirectAddressComputation(index, multiplier, base, shift);

	x86Argument newArg = x86Argument(size, index, multiplier, base, shift);

	switch(op)
	{
	case o_cvtss2sd:
	case o_cvtsd2ss:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argXmmReg)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.xmmArg);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_cvtsi2sd:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argReg)
			{
				assert(ctx.memCache[memIndex].address.ptrSize == sDWORD);

				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.reg);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_cvtsi2sd64:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argReg)
			{
				assert(ctx.memCache[memIndex].address.ptrSize == sQWORD);

				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.reg);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_movss:
	case o_movsd:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argXmmReg)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.xmmArg);
				return;
			}
		}

		// If another register contains data from memory
		for(unsigned i = 0; i < rXmmRegCount; i++)
		{
			if(ctx.xmmReg[i].type == x86Argument::argPtr && ctx.xmmReg[i] == newArg)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, (x86XmmReg)i);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.OverwriteRegisterWithValue(reg1, newArg);
		break;
	case o_addsd:
	case o_subsd:
	case o_mulsd:
	case o_divsd:
	case o_sqrtsd:
	case o_cmpeqsd:
	case o_cmpltsd:
	case o_cmplesd:
	case o_cmpneqsd:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argXmmReg)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.xmmArg);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.ReadAndModifyRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argXmmReg;
	ctx.x86Op->argA.xmmArg = reg1;
	ctx.x86Op->argB.type = x86Argument::argPtr;
	ctx.x86Op->argB.ptrSize = size;
	ctx.x86Op->argB.ptrIndex = index;
	ctx.x86Op->argB.ptrMult = multiplier;
	ctx.x86Op->argB.ptrBase = base;
	ctx.x86Op->argB.ptrNum = shift;
	ctx.x86Op++;
}